

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn.cpp
# Opt level: O0

void asn1::readDER(vector<unsigned_char,_std::allocator<unsigned_char>_> *data,
                  vector<asn1::DER,_std::allocator<asn1::DER>_> *v)

{
  bool bVar1;
  byte bVar2;
  unsigned_short uVar3;
  uint uVar4;
  pair<int,_int> pVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar6;
  string local_f0;
  undefined1 local_d0 [8];
  DER target;
  MemBuffer mb2;
  int iStack_48;
  pair<int,_int> p;
  undefined1 local_38 [8];
  MemBuffer mb;
  vector<asn1::DER,_std::allocator<asn1::DER>_> *v_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  
  mb.readpos = (uint64_t)v;
  MemBuffer::MemBuffer((MemBuffer *)local_38,data);
  while (bVar1 = MemBuffer::done((MemBuffer *)local_38), ((bVar1 ^ 0xffU) & 1) != 0) {
    pVar5 = MemBuffer::readDERHead((MemBuffer *)local_38);
    iStack_48 = pVar5.second;
    MemBuffer::readBuffer((MemBuffer *)&target.value,(MemBuffer *)local_38,iStack_48);
    DER::DER((DER *)local_d0);
    mb2.readpos._4_1_ = (uint8_t)pVar5.first;
    local_d0[0] = mb2.readpos._4_1_;
    pvVar6 = MemBuffer::buffer((MemBuffer *)&target.value);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &target.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,pvVar6);
    target.text.field_2._8_8_ = 0;
    mb2.readpos._4_4_ = pVar5.first;
    if ((mb2.readpos._4_4_ == 0x13) || (mb2.readpos._4_4_ == 0x17)) {
      MemBuffer::readString_abi_cxx11_(&local_f0,(MemBuffer *)&target.value,iStack_48);
      std::__cxx11::string::operator=
                ((string *)
                 &target.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    else if (mb2.readpos._4_4_ == 2) {
      if (iStack_48 == 1) {
        bVar2 = MemBuffer::read<unsigned_char>((MemBuffer *)&target.value);
        target.text.field_2._8_8_ = ZEXT18(bVar2);
      }
      else if (iStack_48 == 2) {
        uVar3 = MemBuffer::read<unsigned_short>((MemBuffer *)&target.value);
        target.text.field_2._8_8_ = ZEXT28(uVar3);
      }
      else if (iStack_48 == 4) {
        uVar4 = MemBuffer::read<unsigned_int>((MemBuffer *)&target.value);
        target.text.field_2._8_8_ = ZEXT48(uVar4);
      }
    }
    else if ((((mb2.readpos._4_4_ != 3) && (mb2.readpos._4_4_ != 4)) && (mb2.readpos._4_4_ != 6)) &&
            (0x2f < mb2.readpos._4_4_)) {
      pvVar6 = MemBuffer::buffer((MemBuffer *)&target.value);
      readDER(pvVar6,(vector<asn1::DER,_std::allocator<asn1::DER>_> *)&target);
    }
    std::vector<asn1::DER,_std::allocator<asn1::DER>_>::push_back
              ((vector<asn1::DER,_std::allocator<asn1::DER>_> *)mb.readpos,(value_type *)local_d0);
    DER::~DER((DER *)local_d0);
    MemBuffer::~MemBuffer((MemBuffer *)&target.value);
  }
  MemBuffer::~MemBuffer((MemBuffer *)local_38);
  return;
}

Assistant:

void readDER(const vector<uint8_t>& data, vector<DER>& v)
{
    MemBuffer mb{data};
    while (!mb.done()) {
        auto p = mb.readDERHead();
        MemBuffer mb2 = mb.readBuffer(p.second);

        DER target;

        target.tag = p.first;
        target.data = mb2.buffer();
        target.value = 0;

        if (p.first == 0x13 || p.first == 0x17) {
            target.text = mb2.readString(p.second);
        } else if (p.first == 0x02) {
            switch (p.second) {
            case 1:
                target.value = mb2.read<uint8_t>();
                break;
            case 2:
                target.value = mb2.read<uint16_t>();
                break;
            case 4:
                target.value = mb2.read<uint32_t>();
                break;
            }
        } else if (p.first == 03 || p.first == 4 || p.first == 6) {
        } else if (p.first >= 0x30) {
            readDER(mb2.buffer(), target.children);
        } else if (p.first == 5) {
        }
        v.push_back(target);
    }
}